

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsCouple.h
# Opt level: O1

void __thiscall chrono::ChShaftsCouple::ArchiveIN(ChShaftsCouple *this,ChArchiveIn *marchive)

{
  ChArchiveIn::VersionRead<chrono::ChShaftsCouple>(marchive);
  ChPhysicsItem::ArchiveIN(&this->super_ChPhysicsItem,marchive);
  return;
}

Assistant:

virtual void ArchiveIN(ChArchiveIn& marchive) override {
        // version number
        /*int version =*/ marchive.VersionRead<ChShaftsCouple>();

        // deserialize parent class:
        ChPhysicsItem::ArchiveIN(marchive);

        // deserialize all member data:
        // marchive >> CHNVP(shaft1);  //***TODO*** serialize, with shared ptr
        // marchive >> CHNVP(shaft2);  //***TODO*** serialize, with shared ptr
    }